

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall pbrt::Array2D<double>::~Array2D(Array2D<double> *this)

{
  int iVar1;
  Bounds2<int> *in_RDI;
  int i;
  int n;
  double *in_stack_ffffffffffffffd8;
  int local_10;
  
  iVar1 = Bounds2<int>::Area(in_RDI);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    pstd::pmr::polymorphic_allocator<std::byte>::destroy<double>
              ((polymorphic_allocator<std::byte> *)(in_RDI + 1),
               (double *)((long)in_RDI[1].pMax.super_Tuple2<pbrt::Point2,_int> + (long)local_10 * 8)
              );
  }
  pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<double>
            ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffd8,0x70aea1);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }